

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall ParseInt8_Both_Test::TestBody(ParseInt8_Both_Test *this)

{
  anon_unknown.dwarf_a555f::AssertInt8Equals('\0',"0",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals('d',"100",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals('{',"123",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals('\x7f',"127",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals(0xff,"255",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals(0xca,"0xca",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals('\x7f',"0x7f",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals(0x80,"0x80",Both);
  anon_unknown.dwarf_a555f::AssertInt8Equals(0xff,"0xff",Both);
  return;
}

Assistant:

TEST(ParseInt8, Both) {
  AssertInt8Equals(0, "0");
  AssertInt8Equals(100, "100");
  AssertInt8Equals(123, "123");
  AssertInt8Equals(127, "127");
  AssertInt8Equals(255, "255");
  AssertInt8Equals(0xca, "0xca");
  AssertInt8Equals(0x7f, "0x7f");
  AssertInt8Equals(0x80, "0x80");
  AssertInt8Equals(0xff, "0xff");
}